

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoordTopocentric.h
# Opt level: O0

CoordTopocentric * __thiscall
CoordTopocentric::operator=(CoordTopocentric *this,CoordTopocentric *topo)

{
  CoordTopocentric *topo_local;
  CoordTopocentric *this_local;
  
  if (this != topo) {
    this->azimuth = topo->azimuth;
    this->elevation = topo->elevation;
    this->range = topo->range;
    this->range_rate = topo->range_rate;
  }
  return this;
}

Assistant:

CoordTopocentric& operator=(const CoordTopocentric& topo)
    {
        if (this != &topo)
        {
            azimuth = topo.azimuth;
            elevation = topo.elevation;
            range = topo.range;
            range_rate = topo.range_rate;
        }
        return *this;
    }